

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case0304(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Ty *pTVar2;
  Expectation *pEVar3;
  socklen_t __len;
  allocator<char> local_58f;
  allocator<char> local_58e;
  allocator<char> local_58d;
  allocator<char> local_58c;
  allocator<char> local_58b;
  allocator<char> local_58a;
  allocator<char> local_589;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8 [32];
  Expectation local_4a8;
  Expectation local_3f0;
  Decl local_338;
  Decl local_270;
  Decl local_1a8;
  Decl local_e0;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_4c8,"void x ( y ( * z ) ( w ) ) ;",&local_589);
  Expectation::Expectation(&local_4a8);
  Decl::Decl(&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"x",&local_58a);
  pDVar1 = Decl::Function(&local_1a8,&local_4e8,File);
  pDVar1 = Ty::Void(&pDVar1->ty_,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Function,None,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,"y",&local_58b);
  pDVar1 = Ty::Typedef(pTVar2,&local_508,None);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pDVar1 = Ty::Derived(pTVar2,Function,None,None);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pTVar2 = Ty::addParam(pTVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"w",&local_58c);
  pDVar1 = Ty::Typedef(pTVar2,&local_528,None);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pDVar1 = Ty::Derived(pTVar2,Pointer,None,None);
  Decl::Decl(&local_e0,pDVar1);
  pEVar3 = Expectation::declaration(&local_4a8,&local_e0);
  Decl::Decl(&local_338);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"z",&local_58d);
  pDVar1 = Decl::Object(&local_338,&local_548,ParameterDeclaration,FunctionPrototype);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"y",&local_58e);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_568,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Function,None,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"w",&local_58f);
  pDVar1 = Ty::Typedef(pTVar2,&local_588,None);
  __len = 0;
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  Decl::Decl(&local_270,pDVar1);
  pEVar3 = Expectation::declaration(pEVar3,&local_270);
  Expectation::Expectation(&local_3f0,pEVar3);
  bind(this,(int)local_4c8,(sockaddr *)&local_3f0,__len);
  Expectation::~Expectation(&local_3f0);
  Decl::~Decl(&local_270);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_548);
  Decl::~Decl(&local_338);
  Decl::~Decl(&local_e0);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4e8);
  Decl::~Decl(&local_1a8);
  Expectation::~Expectation(&local_4a8);
  std::__cxx11::string::~string(local_4c8);
  return;
}

Assistant:

void DeclarationBinderTester::case0304()
{
    bind("void x ( y ( * z ) ( w ) ) ;",
         Expectation()
         .declaration(Decl()
                  .Function("x", ScopeKind::File)
                  .ty_.Void()
                  .ty_.Derived(TypeKind::Function)
                  .ty_.addParam().Typedef("y")
                  .ty_.atParam().Derived(TypeKind::Function)
                  .ty_.atParam().addParam().Typedef("w")
                  .ty_.atParam().Derived(TypeKind::Pointer))
         .declaration(Decl()
                  .Object("z", SymbolKind::ParameterDeclaration, ScopeKind::FunctionPrototype)
                  .ty_.Typedef("y")
                  .ty_.Derived(TypeKind::Function)
                  .ty_.addParam().Typedef("w")
                  .ty_.Derived(TypeKind::Pointer)));
}